

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

string * __thiscall
glcts::ViewportArray::DepthRange::getGeometryShader_abi_cxx11_
          (string *__return_storage_ptr__,DepthRange *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${GEOMETRY_SHADER_ENABLE}\n${VIEWPORT_ARRAY_ENABLE}\n\nlayout(points, invocations = 16)         in;\nlayout(triangle_strip, max_vertices = 8) out;\n\nvoid main()\n{\n    const float top_z    = 1.0;\n    const float bottom_z = -1.0;\n\n    /* Bottom */\n    gl_ViewportIndex = gl_InvocationID;\n    gl_Position  = vec4(-1, -1, bottom_z, 1);\n    EmitVertex();\n    gl_ViewportIndex = gl_InvocationID;\n    gl_Position  = vec4(-1, 0, bottom_z, 1);\n    EmitVertex();\n    gl_ViewportIndex = gl_InvocationID;\n    gl_Position  = vec4(1, -1, bottom_z, 1);\n    EmitVertex();\n    gl_ViewportIndex = gl_InvocationID;\n    gl_Position  = vec4(1, 0, bottom_z, 1);\n    EmitVertex();\n    EndPrimitive();\n\n    /* Top */\n    gl_ViewportIndex = gl_InvocationID;\n    gl_Position  = vec4(-1, 0, top_z, 1);\n    EmitVertex();\n    gl_ViewportIndex = gl_InvocationID;\n    gl_Position  = vec4(-1, 1, top_z, 1);\n    EmitVertex();\n    gl_ViewportIndex = gl_InvocationID;\n    gl_Position  = vec4(1, 0, top_z, 1);\n    EmitVertex();\n    gl_ViewportIndex = gl_InvocationID;\n    gl_Position  = vec4(1, 1, top_z, 1);\n    EmitVertex();\n    EndPrimitive();\n}\n\n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

std::string DepthRange::getGeometryShader()
{
	static const GLchar* source = "${VERSION}\n"
								  "\n"
								  "${GEOMETRY_SHADER_ENABLE}\n"
								  "${VIEWPORT_ARRAY_ENABLE}\n"
								  "\n"
								  "layout(points, invocations = 16)         in;\n"
								  "layout(triangle_strip, max_vertices = 8) out;\n"
								  "\n"
								  "void main()\n"
								  "{\n"
								  "    const float top_z    = 1.0;\n"
								  "    const float bottom_z = -1.0;\n"
								  "\n"
								  "    /* Bottom */\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Position  = vec4(-1, -1, bottom_z, 1);\n"
								  "    EmitVertex();\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Position  = vec4(-1, 0, bottom_z, 1);\n"
								  "    EmitVertex();\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Position  = vec4(1, -1, bottom_z, 1);\n"
								  "    EmitVertex();\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Position  = vec4(1, 0, bottom_z, 1);\n"
								  "    EmitVertex();\n"
								  "    EndPrimitive();\n"
								  "\n"
								  "    /* Top */\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Position  = vec4(-1, 0, top_z, 1);\n"
								  "    EmitVertex();\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Position  = vec4(-1, 1, top_z, 1);\n"
								  "    EmitVertex();\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Position  = vec4(1, 0, top_z, 1);\n"
								  "    EmitVertex();\n"
								  "    gl_ViewportIndex = gl_InvocationID;\n"
								  "    gl_Position  = vec4(1, 1, top_z, 1);\n"
								  "    EmitVertex();\n"
								  "    EndPrimitive();\n"
								  "}\n"
								  "\n";

	std::string result = source;

	return result;
}